

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O0

int __thiscall
Inter_Symbol_Generator::Matrix_A_Generator(Inter_Symbol_Generator *this,Array_Data_Symbol *p)

{
  uchar uVar1;
  uint8_t **ppuVar2;
  reference puVar3;
  uint local_20;
  uint local_1c;
  int j;
  int i;
  Array_Data_Symbol *p_local;
  Inter_Symbol_Generator *this_local;
  
  if ((this->_A != (uint8_t **)0x0) && (this->_A != (uint8_t **)0x0)) {
    operator_delete(this->_A,8);
  }
  ppuVar2 = new_matrix(this,p->L,p->L);
  this->_A = ppuVar2;
  LDPC_Matrix_Generator(this,p);
  HALF_Matrix_Generator(this,p);
  I_S_Matrix_Generator(this,p);
  I_H_Matrix_Generator(this,p);
  Zero_SxH_Matrix_Generator(this,p);
  G_LT_Matrix_Generator(this,p);
  matrix_copy_to(this,this->G_LDPC,p->S,p->K,this->_A,0,0);
  matrix_copy_to(this,this->I_S,p->S,p->S,this->_A,0,p->K);
  matrix_copy_to(this,this->Zero_SxH,p->S,p->H,this->_A,0,p->K + p->S);
  matrix_copy_to(this,this->G_HALF,p->H,p->K + p->S,this->_A,p->S,0);
  matrix_copy_to(this,this->I_H,p->H,p->H,this->_A,p->S,p->K + p->S);
  matrix_copy_to(this,this->G_LT,p->K,p->L,this->_A,p->S + p->H,0);
  boost::numeric::ublas::
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::resize(&this->A,(ulong)p->L,(ulong)p->L,true);
  for (local_1c = 0; local_1c < p->L; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < p->L; local_20 = local_20 + 1) {
      uVar1 = this->_A[(int)local_1c][(int)local_20];
      puVar3 = boost::numeric::ublas::
               matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator()(&this->A,(long)(int)local_1c,(long)(int)local_20);
      *puVar3 = uVar1;
    }
  }
  return 0;
}

Assistant:

int Inter_Symbol_Generator::Matrix_A_Generator(class Array_Data_Symbol *p)
{

	if (_A != NULL)
	{
		delete _A;
	}

	_A = new_matrix(p->L, p->L);


	LDPC_Matrix_Generator(p);
	HALF_Matrix_Generator(p);
	I_S_Matrix_Generator(p);
	I_H_Matrix_Generator(p);
	Zero_SxH_Matrix_Generator(p);
	G_LT_Matrix_Generator(p);


	matrix_copy_to(G_LDPC, p->S, p->K, _A, 0, 0);
	matrix_copy_to(I_S, p->S, p->S, _A, 0, p->K);
	matrix_copy_to(Zero_SxH, p->S, p->H, _A, 0, (p->K + p->S));
	matrix_copy_to(G_HALF, p->H, (p->K + p->S), _A, p->S, 0);
	matrix_copy_to(I_H, p->H, p->H, _A, p->S, (p->K + p->S));
	matrix_copy_to(G_LT, p->K, p->L, _A, (p->S + p->H), 0);

	A.resize(p->L, p->L);
	//matrix_A = boost::numeric::ublas::make_matrix_from_pointer(A);

	for (int i = 0; i < p->L; i++)
	{
		for (int j = 0; j < p->L; j++)
		{
			A(i,j) = _A[i][j];
		}
	}
	return 0;
}